

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

FinalizableObject * __thiscall
TTD::ThreadContextTTD::GetRuntimeContextForScriptContext(ThreadContextTTD *this,ScriptContext *ctx)

{
  Type piVar1;
  DictionaryStats *pDVar2;
  uint uVar3;
  Type pSVar4;
  uint uVar5;
  
  piVar1 = (this->m_ttdContextToExternalRefMap).buckets;
  uVar3 = 0;
  if (piVar1 != (Type)0x0) {
    uVar3 = JsUtil::
            BaseDictionary<Js::ScriptContext_*,_FinalizableObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((uint)((ulong)ctx >> 3) | 1,(this->m_ttdContextToExternalRefMap).bucketCount
                        ,(this->m_ttdContextToExternalRefMap).modFunctionIndex);
    uVar5 = piVar1[uVar3];
    uVar3 = 0;
    if (-1 < (int)uVar5) {
      pSVar4 = (this->m_ttdContextToExternalRefMap).entries;
      uVar3 = 0;
      do {
        if (pSVar4[uVar5].
            super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
            super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
            .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.key == ctx) {
          pDVar2 = (this->m_ttdContextToExternalRefMap).stats;
          if (pDVar2 != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pDVar2,uVar3);
            pSVar4 = (this->m_ttdContextToExternalRefMap).entries;
          }
          return pSVar4[uVar5].
                 super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
                 super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
                 .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.value;
        }
        uVar3 = uVar3 + 1;
        uVar5 = pSVar4[uVar5].
                super_DefaultHashedEntry<Js::ScriptContext_*,_FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<Js::ScriptContext_*,_FinalizableObject_*>.
                super_ValueEntry<FinalizableObject_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>_>
                .super_KeyValueEntryDataLayout2<Js::ScriptContext_*,_FinalizableObject_*>.next;
      } while (-1 < (int)uVar5);
    }
  }
  pDVar2 = (this->m_ttdContextToExternalRefMap).stats;
  if (pDVar2 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pDVar2,uVar3);
  }
  return (FinalizableObject *)0x0;
}

Assistant:

FinalizableObject* ThreadContextTTD::GetRuntimeContextForScriptContext(Js::ScriptContext* ctx)
    {
        return this->m_ttdContextToExternalRefMap.Lookup(ctx, nullptr);
    }